

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O2

void __thiscall TrodesMsg::appendArg(TrodesMsg *this,char c,uint8_t a)

{
  string *this_00;
  allocator local_11;
  
  if (c == '1') {
    zmsg_addstrf(this->msg,"%u",(ulong)a);
    return;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string
            (this_00,"Could not append to msg. Expected a different type, got uint8",&local_11);
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void TrodesMsg::appendArg (const char c, const uint8_t a){
    if(c != '1') throw std::string(APPENDERROR "uint8");
    zmsg_addstrf (msg, "%" PRIu8, a);
}